

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> __thiscall
enact::Parser::expectBlock(Parser *this,string *msg)

{
  bool bVar1;
  ParseError *__return_storage_ptr__;
  string *in_RDX;
  undefined1 local_38 [32];
  string *msg_local;
  Parser *this_local;
  
  local_38._24_8_ = in_RDX;
  msg_local = msg;
  this_local = this;
  bVar1 = consume((Parser *)msg,EQUAL_GREATER);
  if (!bVar1) {
    bVar1 = consume((Parser *)msg,LEFT_BRACE);
    if (!bVar1) {
      __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
      errorAtCurrent(__return_storage_ptr__,(Parser *)msg,(string *)local_38._24_8_);
      __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,ParseError::~ParseError);
    }
  }
  parseBlockExpr((Parser *)local_38);
  static_unique_ptr_cast<enact::BlockExpr,enact::Expr>
            ((enact *)this,(unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_38);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_38);
  return (__uniq_ptr_data<enact::BlockExpr,_std::default_delete<enact::BlockExpr>,_true,_true>)
         (__uniq_ptr_data<enact::BlockExpr,_std::default_delete<enact::BlockExpr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<BlockExpr> Parser::expectBlock(const std::string &msg) {
        if (!consume(TokenType::EQUAL_GREATER) && !consume(TokenType::LEFT_BRACE)) {
            throw errorAtCurrent(msg);
        }
        return static_unique_ptr_cast<BlockExpr>(parseBlockExpr());
    }